

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O3

void __thiscall
swrenderer::DrawTiltedSpanPalCommand::CalcTiltedLighting
          (DrawTiltedSpanPalCommand *this,double lval,double lend,int width,DrawerThread *thread)

{
  uint8_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint8_t **ppuVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  uint8_t *in_RCX;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  
  if ((width == 0) || (lval == lend)) {
    if (24.0 <= lval) {
      lval = 24.0;
    }
    uVar10 = this->planeshade - SUB84(lval + 103079215104.0,0) >> 0x10;
    uVar8 = 0x1f;
    if ((int)uVar10 < 0x1f) {
      uVar8 = uVar10;
    }
    uVar10 = 0;
    if ((int)uVar8 < 1) {
      uVar8 = uVar10;
    }
    uVar9 = (ulong)(uVar8 << 8);
  }
  else {
    dVar13 = (lend - lval) / (double)width;
    if (24.0 <= lval) {
      dVar14 = 24.0;
      if (lval <= 24.0) {
        dVar14 = lval;
      }
      iVar7 = this->planeshade - SUB84(dVar14 + 103079215104.0,0) >> 0x10;
      iVar6 = 0x1f;
      if (iVar7 < 0x1f) {
        iVar6 = iVar7;
      }
      uVar9 = 0;
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      in_RCX = this->basecolormapdata + (uint)(iVar6 << 8);
      if (-1 < width) {
        uVar5 = 0;
        do {
          thread->tiltlighting[uVar5] = in_RCX;
          lval = lval + dVar13;
          uVar9 = uVar5 + 1;
          if ((uint)width <= uVar5) break;
          uVar5 = uVar9;
        } while (24.0 <= lval);
      }
    }
    else {
      uVar9 = 0;
    }
    uVar10 = (uint)uVar9;
    if (24.0 <= lend) {
      dVar14 = 24.0;
      if (lend <= 24.0) {
        dVar14 = lend;
      }
      iVar7 = this->planeshade - SUB84(dVar14 + 103079215104.0,0) >> 0x10;
      iVar6 = 0x1f;
      if (iVar7 < 0x1f) {
        iVar6 = iVar7;
      }
      iVar7 = 0;
      if (0 < iVar6) {
        iVar7 = iVar6;
      }
      in_RCX = this->basecolormapdata + (uint)(iVar7 << 8);
      if ((int)uVar10 < width) {
        lVar11 = (long)width;
        do {
          thread->tiltlighting[lVar11] = in_RCX;
          lend = lend - dVar13;
          width = width - 1;
          if (lVar11 + -1 <= (long)(int)uVar10) break;
          lVar11 = lVar11 + -1;
        } while (24.0 <= lend);
      }
    }
    if (width < 1) goto LAB_002db14f;
    dVar14 = (double)this->planeshade * 1.52587890625e-05 - lval;
    dVar13 = (lval - lend) / (double)width;
    if (dVar13 < 0.0) {
      if (1.0 <= dVar14) {
        if (32.0 <= dVar14) {
          if (width < (int)uVar10) {
            uVar9 = uVar9 & 0xffffffff;
          }
          else {
            puVar1 = this->basecolormapdata;
            ppuVar4 = thread->tiltlighting + (uVar9 & 0xffffffff);
            do {
              *ppuVar4 = puVar1 + 0x1f00;
              dVar14 = dVar14 + dVar13;
              iVar6 = (int)uVar9;
              uVar9 = (ulong)(iVar6 + 1);
              if (dVar14 < 32.0) break;
              ppuVar4 = ppuVar4 + 1;
            } while (iVar6 < width);
          }
          if (width < (int)uVar9) {
            return;
          }
        }
        if (((int)uVar9 <= width) && (0.0 <= dVar14)) {
          uVar5 = (long)(int)uVar9;
          do {
            thread->tiltlighting[uVar5] =
                 this->basecolormapdata + (SUB84(dVar14 + 6755399441055744.0,0) << 8);
            uVar9 = uVar5 + 1;
            if ((long)(ulong)(uint)width <= (long)uVar5) break;
            dVar14 = dVar14 + dVar13;
            uVar5 = uVar9;
          } while (0.0 <= dVar14);
        }
      }
      uVar10 = (uint)uVar9;
      in_RCX = this->basecolormapdata;
      goto LAB_002db14f;
    }
    if (dVar14 < 31.0) {
      if ((int)uVar10 <= width && dVar14 < 0.0) {
        puVar1 = this->basecolormapdata;
        ppuVar4 = thread->tiltlighting + (uVar9 & 0xffffffff);
        do {
          *ppuVar4 = puVar1;
          dVar14 = dVar14 + dVar13;
          iVar6 = (int)uVar9;
          uVar10 = iVar6 + 1;
          if (0.0 <= dVar14) break;
          ppuVar4 = ppuVar4 + 1;
          uVar9 = (ulong)uVar10;
        } while (iVar6 < width);
      }
      if (width < (int)uVar10) {
        return;
      }
      if (dVar14 < 31.0) {
        ppuVar4 = thread->tiltlighting + uVar10;
        uVar8 = uVar10;
        do {
          *ppuVar4 = this->basecolormapdata + (SUB84(dVar14 + 6755399441055744.0,0) << 8);
          uVar10 = uVar8 + 1;
          if (width <= (int)uVar8) break;
          dVar14 = dVar14 + dVar13;
          ppuVar4 = ppuVar4 + 1;
          uVar8 = uVar10;
        } while (dVar14 < 31.0);
      }
      in_RCX = this->basecolormapdata + 0x1f00;
      goto LAB_002db14f;
    }
    uVar9 = 0x1f00;
  }
  in_RCX = this->basecolormapdata + uVar9;
LAB_002db14f:
  auVar3 = _DAT_005d6240;
  auVar2 = _DAT_005d6230;
  uVar8 = width - uVar10;
  if ((int)uVar10 <= width) {
    auVar12._4_4_ = 0;
    auVar12._0_4_ = uVar8;
    auVar12._8_4_ = uVar8;
    auVar12._12_4_ = 0;
    uVar9 = 0;
    auVar12 = auVar12 ^ _DAT_005d6240;
    do {
      auVar15._8_4_ = (int)uVar9;
      auVar15._0_8_ = uVar9;
      auVar15._12_4_ = (int)(uVar9 >> 0x20);
      auVar15 = (auVar15 | auVar2) ^ auVar3;
      if ((bool)(~(auVar15._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar15._0_4_ ||
                  auVar12._4_4_ < auVar15._4_4_) & 1)) {
        thread->tiltlighting[(long)(int)uVar10 + uVar9] = in_RCX;
      }
      if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
          auVar15._12_4_ <= auVar12._12_4_) {
        thread->tiltlighting[(long)(int)uVar10 + uVar9 + 1] = in_RCX;
      }
      uVar9 = uVar9 + 2;
    } while (((ulong)uVar8 + 2 & 0xfffffffffffffffe) != uVar9);
  }
  return;
}

Assistant:

void DrawTiltedSpanPalCommand::CalcTiltedLighting(double lval, double lend, int width, DrawerThread *thread)
	{
		const uint8_t **tiltlighting = thread->tiltlighting;

		double lstep;
		uint8_t *lightfiller;
		int i = 0;

		if (width == 0 || lval == lend)
		{ // Constant lighting
			lightfiller = basecolormapdata + (GETPALOOKUP(lval, planeshade) << COLORMAPSHIFT);
		}
		else
		{
			lstep = (lend - lval) / width;
			if (lval >= MAXLIGHTVIS)
			{ // lval starts "too bright".
				lightfiller = basecolormapdata + (GETPALOOKUP(lval, planeshade) << COLORMAPSHIFT);
				for (; i <= width && lval >= MAXLIGHTVIS; ++i)
				{
					tiltlighting[i] = lightfiller;
					lval += lstep;
				}
			}
			if (lend >= MAXLIGHTVIS)
			{ // lend ends "too bright".
				lightfiller = basecolormapdata + (GETPALOOKUP(lend, planeshade) << COLORMAPSHIFT);
				for (; width > i && lend >= MAXLIGHTVIS; --width)
				{
					tiltlighting[width] = lightfiller;
					lend -= lstep;
				}
			}
			if (width > 0)
			{
				lval = FIXED2DBL(planeshade) - lval;
				lend = FIXED2DBL(planeshade) - lend;
				lstep = (lend - lval) / width;
				if (lstep < 0)
				{ // Going from dark to light
					if (lval < 1.)
					{ // All bright
						lightfiller = basecolormapdata;
					}
					else
					{
						if (lval >= NUMCOLORMAPS)
						{ // Starts beyond the dark end
							uint8_t *clight = basecolormapdata + ((NUMCOLORMAPS - 1) << COLORMAPSHIFT);
							while (lval >= NUMCOLORMAPS && i <= width)
							{
								tiltlighting[i++] = clight;
								lval += lstep;
							}
							if (i > width)
								return;
						}
						while (i <= width && lval >= 0)
						{
							tiltlighting[i++] = basecolormapdata + (xs_ToInt(lval) << COLORMAPSHIFT);
							lval += lstep;
						}
						lightfiller = basecolormapdata;
					}
				}
				else
				{ // Going from light to dark
					if (lval >= (NUMCOLORMAPS - 1))
					{ // All dark
						lightfiller = basecolormapdata + ((NUMCOLORMAPS - 1) << COLORMAPSHIFT);
					}
					else
					{
						while (lval < 0 && i <= width)
						{
							tiltlighting[i++] = basecolormapdata;
							lval += lstep;
						}
						if (i > width)
							return;
						while (i <= width && lval < (NUMCOLORMAPS - 1))
						{
							tiltlighting[i++] = basecolormapdata + (xs_ToInt(lval) << COLORMAPSHIFT);
							lval += lstep;
						}
						lightfiller = basecolormapdata + ((NUMCOLORMAPS - 1) << COLORMAPSHIFT);
					}
				}
			}
		}
		for (; i <= width; i++)
		{
			tiltlighting[i] = lightfiller;
		}
	}